

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6.c
# Opt level: O0

int lrtr_ipv6_str_to_addr(char *a,lrtr_ipv6_addr *ip)

{
  long lVar1;
  lrtr_ipv6_addr *str;
  int iVar2;
  long in_FS_OFFSET;
  char *start;
  int local_58;
  int hfil;
  int l;
  int k;
  int j;
  int i;
  uint32_t *o;
  lrtr_ipv6_addr *ip_local;
  char *a_local;
  undefined2 auStack_28 [2];
  lrtr_ipv4_addr addr4;
  uint16_t words [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ip_local = (lrtr_ipv6_addr *)a;
  if (*a == ':') {
    if (a[1] != ':') {
      a_local._0_4_ = -1;
      goto LAB_00106dd2;
    }
    ip_local = (lrtr_ipv6_addr *)(a + 1);
  }
  start._4_4_ = -1;
  k = 0;
LAB_00106b14:
  for (; str = ip_local, (char)ip_local->addr[0] != '\0';
      ip_local = (lrtr_ipv6_addr *)((long)ip_local->addr + 1)) {
    if ((char)ip_local->addr[0] != ':') {
      l = 0;
      local_58 = 0;
      do {
        if (((char)ip_local->addr[0] < '0') || ('9' < (char)ip_local->addr[0])) {
          if (((char)ip_local->addr[0] < 'A') || ('F' < (char)ip_local->addr[0])) {
            if (((char)ip_local->addr[0] < 'a') || ('f' < (char)ip_local->addr[0]))
            goto LAB_00106c3f;
            hfil = (char)ip_local->addr[0] + -0x57;
          }
          else {
            hfil = (char)ip_local->addr[0] + -0x37;
          }
        }
        else {
          hfil = (char)ip_local->addr[0] + -0x30;
        }
        ip_local = (lrtr_ipv6_addr *)((long)ip_local->addr + 1);
        l = l * 0x10 + hfil;
        if ((0xffff < l) || (local_58 = local_58 + 1, 4 < local_58)) {
          a_local._0_4_ = -1;
          goto LAB_00106dd2;
        }
      } while( true );
    }
    if (-1 < start._4_4_) {
      a_local._0_4_ = -1;
      goto LAB_00106dd2;
    }
    start._4_4_ = k;
  }
LAB_00106d22:
  if (-1 < start._4_4_) {
    iVar2 = 8 - k;
    for (k = 7; start._4_4_ <= k - iVar2; k = k + -1) {
      auStack_28[k] = auStack_28[k - iVar2];
    }
    for (; start._4_4_ <= k; k = k + -1) {
      auStack_28[k] = 0;
    }
  }
  for (k = 0; k < 4; k = k + 1) {
    ip->addr[k] = CONCAT22(auStack_28[k << 1],auStack_28[k * 2 + 1]);
  }
  a_local._0_4_ = 0;
LAB_00106dd2:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (int)a_local;
LAB_00106c3f:
  if (((char)ip_local->addr[0] == ':') && (*(char *)((long)ip_local->addr + 1) != '\0')) {
    ip_local = (lrtr_ipv6_addr *)((long)ip_local->addr + 1);
  }
  else {
    if (((char)ip_local->addr[0] == '.') && ((k == 6 || ((k < 6 && (-1 < start._4_4_)))))) {
      iVar2 = lrtr_ipv4_str_to_addr((char *)str,(lrtr_ipv4_addr *)((long)&a_local + 4));
      if (iVar2 == -1) {
        a_local._0_4_ = -1;
        goto LAB_00106dd2;
      }
      iVar2 = k + 1;
      auStack_28[k] = (short)((uint)a_local._4_4_ >> 0x10);
      k = k + 2;
      auStack_28[iVar2] = (short)a_local._4_4_;
      goto LAB_00106d22;
    }
    if ((char)ip_local->addr[0] != '\0') {
      a_local._0_4_ = -1;
      goto LAB_00106dd2;
    }
  }
  if (7 < k) {
    a_local._0_4_ = -1;
    goto LAB_00106dd2;
  }
  auStack_28[k] = (short)l;
  k = k + 1;
  goto LAB_00106b14;
}

Assistant:

int lrtr_ipv6_str_to_addr(const char *a, struct lrtr_ipv6_addr *ip)
{
	uint32_t *o = ip->addr;
	uint16_t words[8];
	int i, j, k, l, hfil;
	const char *start;

	if (a[0] == ':') { /* Leading :: */
		if (a[1] != ':')
			return -1;
		a++;
	}
	hfil = -1;
	i = 0;
	while (*a) {
		if (*a == ':') { /* :: */
			if (hfil >= 0)
				return -1;
			hfil = i;
			a++;
			continue;
		}
		j = 0;
		l = 0;
		start = a;
		for (;;) {
			if (*a >= '0' && *a <= '9')
				k = *a++ - '0';
			else if (*a >= 'A' && *a <= 'F')
				k = *a++ - 'A' + 10;
			else if (*a >= 'a' && *a <= 'f')
				k = *a++ - 'a' + 10;
			else
				break;
			j = (j << 4) + k;
			if (j >= 0x10000 || ++l > 4)
				return -1;
		}
		if (*a == ':' && a[1]) {
			a++;
		} else if (*a == '.' && (i == 6 || (i < 6 && hfil >= 0))) { /* Embedded IPv4 address */
			struct lrtr_ipv4_addr addr4;

			if (lrtr_ipv4_str_to_addr(start, &addr4) == -1)
				return -1;
			words[i++] = addr4.addr >> 16;
			words[i++] = addr4.addr;
			break;
		} else if (*a) {
			return -1;
		}
		if (i >= 8)
			return -1;
		words[i++] = j;
	}

	/* Replace :: with an appropriate quantity of zeros */
	if (hfil >= 0) {
		j = 8 - i;
		for (i = 7; i - j >= hfil; i--)
			words[i] = words[i - j];
		for (; i >= hfil; i--)
			words[i] = 0;
	}

	/* Convert the address to lrtr_ip_addr format */
	for (i = 0; i < 4; i++)
		o[i] = (words[2 * i] << 16) | words[2 * i + 1];
	return 0;
}